

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  SyMemMethods *local_60;
  undefined1 local_58 [8];
  char zData [34];
  char zKey [12];
  int i;
  int rc;
  unqlite *pDb;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  pDb = (unqlite *)argv;
  argv_local._0_4_ = argc;
  puts(
      "============================================================\nUnQLite VFS DemoFile Functions                              \n                                         http://unqlite.org/\n============================================================\n"
      );
  puts("Starting vfs set\n");
  unqlite_start();
  puts("Successfully vfs set\n");
  if ((int)argv_local < 2) {
    local_60 = (SyMemMethods *)0x16603d;
  }
  else {
    local_60 = (pDb->sMem).pMethods;
  }
  zKey._8_4_ = unqlite_open((unqlite **)&i,(char *)local_60,4);
  if (zKey._8_4_ != 0) {
    Fatal((unqlite *)0x0,"Out of memory");
  }
  zKey[4] = '\0';
  zKey[5] = '\0';
  zKey[6] = '\0';
  zKey[7] = '\0';
  for (; (int)zKey._4_4_ < 0x14; zKey._4_4_ = zKey._4_4_ + 1) {
    unqlite_util_random_string(_i,zData + 0x1c,0xc);
    zKey._8_4_ = unqlite_kv_store(_i,zData + 0x1c,0xc,local_58,0x22);
    if (zKey._8_4_ != 0) break;
    puts("Key Successfully stored");
  }
  if (zKey._8_4_ != 0) {
    iVar1 = unqlite_rollback(_i);
    puts("Rollback OK, even if it wasn\'t expected");
    if (iVar1 != 0) {
      Fatal(_i,(char *)0x0);
    }
  }
  unqlite_close(_i);
  puts("AutoCommit and Close");
  return argv_local._4_4_;
}

Assistant:

int main(int argc,char *argv[])
{
	unqlite *pDb;       /* Database handle */
	int rc;
	int i;
	
	/* Print Banner */
	puts(zBanner);
	puts("Starting vfs set\n");	
	/* Configure with our own vfs and page size */
	unqlite_start();
	puts("Successfully vfs set\n");	
	
	/* Open our database */
	/* Pass a real db file to test the this vfs*/
	rc = unqlite_open(&pDb,argc > 1 ? argv[1] /* On-disk DB */ : ":mem:" /* In-mem DB */,UNQLITE_OPEN_CREATE);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Out of memory");
	}
	/* Taken from 1.c, just store some values as example */
	/* Store 20 random records.*/
	for(i = 0 ; i < 20 ; ++i ){
		char zKey[12]; /* Random generated key */
		char zData[34]; /* Dummy data */
		
		/* Generate the random key */
		unqlite_util_random_string(pDb,zKey,sizeof(zKey));
		
		/* Perform the insertion */
		rc = unqlite_kv_store(pDb,zKey,sizeof(zKey),zData,sizeof(zData));
		if( rc != UNQLITE_OK ){
			break;
		}
		puts("Key Successfully stored");
	}
	if( rc != UNQLITE_OK ){
		/* Insertion fail, rollback the transaction  */
		rc = unqlite_rollback(pDb);
		puts("Rollback OK, even if it wasn't expected");
		if( rc != UNQLITE_OK ){
			/* Extract database error log and exit */
			Fatal(pDb,0);
		}
	}
	
	/* Auto-commit the transaction and close our handle */
	unqlite_close(pDb);
	puts("AutoCommit and Close");
}